

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2builderutil_closed_set_normalizer.cc
# Opt level: O0

void __thiscall
s2builderutil::NormalizeClosedSetImpl::Build
          (NormalizeClosedSetImpl *this,int dimension,Graph *g,S2Error *error)

{
  int iVar1;
  reference pvVar2;
  vector<S2Builder::Graph,_std::allocator<S2Builder::Graph>_> *__x;
  reference this_00;
  pointer pLVar3;
  int local_44;
  undefined1 local_40 [4];
  int dim;
  vector<S2Builder::Graph,_std::allocator<S2Builder::Graph>_> output;
  S2Error *error_local;
  Graph *g_local;
  int dimension_local;
  NormalizeClosedSetImpl *this_local;
  
  output.super__Vector_base<S2Builder::Graph,_std::allocator<S2Builder::Graph>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)error;
  pvVar2 = std::vector<S2Builder::Graph,_std::allocator<S2Builder::Graph>_>::operator[]
                     (&this->graphs_,(long)dimension);
  S2Builder::Graph::operator=(pvVar2,g);
  iVar1 = this->graphs_left_ + -1;
  this->graphs_left_ = iVar1;
  if (iVar1 < 1) {
    __x = ClosedSetNormalizer::Run
                    (&this->normalizer_,&this->graphs_,
                     (S2Error *)
                     output.super__Vector_base<S2Builder::Graph,_std::allocator<S2Builder::Graph>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage);
    std::vector<S2Builder::Graph,_std::allocator<S2Builder::Graph>_>::vector
              ((vector<S2Builder::Graph,_std::allocator<S2Builder::Graph>_> *)local_40,__x);
    for (local_44 = 0; local_44 < 3; local_44 = local_44 + 1) {
      this_00 = std::
                vector<std::unique_ptr<S2Builder::Layer,_std::default_delete<S2Builder::Layer>_>,_std::allocator<std::unique_ptr<S2Builder::Layer,_std::default_delete<S2Builder::Layer>_>_>_>
                ::operator[](&this->output_layers_,(long)local_44);
      pLVar3 = std::unique_ptr<S2Builder::Layer,_std::default_delete<S2Builder::Layer>_>::operator->
                         (this_00);
      pvVar2 = std::vector<S2Builder::Graph,_std::allocator<S2Builder::Graph>_>::operator[]
                         ((vector<S2Builder::Graph,_std::allocator<S2Builder::Graph>_> *)local_40,
                          (long)local_44);
      (*pLVar3->_vptr_Layer[3])
                (pLVar3,pvVar2,
                 output.super__Vector_base<S2Builder::Graph,_std::allocator<S2Builder::Graph>_>.
                 _M_impl.super__Vector_impl_data._M_end_of_storage);
    }
    std::vector<S2Builder::Graph,_std::allocator<S2Builder::Graph>_>::~vector
              ((vector<S2Builder::Graph,_std::allocator<S2Builder::Graph>_> *)local_40);
  }
  return;
}

Assistant:

void Build(int dimension, const Graph& g, S2Error* error) {
    // Errors are reported only on the last layer built.
    graphs_[dimension] = g;
    if (--graphs_left_ > 0) return;

    vector<Graph> output = normalizer_.Run(graphs_, error);
    for (int dim = 0; dim < 3; ++dim) {
      output_layers_[dim]->Build(output[dim], error);
    }
  }